

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

void __thiscall
compiler::CompilerAstWalker::onExitWhileStatementAstNode
          (CompilerAstWalker *this,WhileStatementAstNode *param_1)

{
  pointer *ppuVar1;
  element_type *peVar2;
  pointer puVar3;
  pointer puVar4;
  size_type __n;
  pointer pBVar5;
  pointer pBVar6;
  size_type *psVar7;
  reference pvVar8;
  iterator iVar9;
  reference pvVar10;
  size_type *psVar11;
  size_t sVar12;
  undefined1 auStack_58 [8];
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> vec;
  value_type local_30;
  size_t loopStartIndex;
  
  peVar2 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  puVar3 = (peVar2->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (peVar2->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_58,
             "onExitWhileStatementAstNode encountered while exit statement but loopStartIndices is empty"
             ,(allocator<char> *)&local_30);
  Error::assertWithPanic(puVar3 != puVar4,(string *)auStack_58);
  std::__cxx11::string::~string((string *)auStack_58);
  peVar2 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  puVar3 = (peVar2->loopConditionEvalJumpIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (peVar2->loopConditionEvalJumpIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_58,
             "onExitWhileStatementAstNode encountered while exit statement but loopConditionEvalJumpIndices is empty"
             ,(allocator<char> *)&local_30);
  Error::assertWithPanic(puVar3 != puVar4,(string *)auStack_58);
  std::__cxx11::string::~string((string *)auStack_58);
  peVar2 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&peVar2->loopStartIndices,
                      ((long)(peVar2->loopStartIndices).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(peVar2->loopStartIndices).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) - 1);
  local_30 = *pvVar8;
  peVar2 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&peVar2->loopConditionEvalJumpIndices,
                      ((long)(peVar2->loopConditionEvalJumpIndices).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(peVar2->loopConditionEvalJumpIndices).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) - 1);
  __n = *pvVar8;
  iVar9 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(((this->ec).
                    super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->breakStatementsForLoops)._M_h,&local_30);
  auStack_58 = (undefined1  [8])0x0;
  vec.
  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  if (iVar9.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    std::
    __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)auStack_58,
                (__shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)((long)iVar9.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
                          ._M_cur + 0x10));
  }
  emit(this,Jump,local_30);
  peVar2 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pBVar5 = (peVar2->byteCode).
           super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pBVar6 = (peVar2->byteCode).
           super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar10 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::at
                      (&peVar2->byteCode,__n);
  sVar12 = (long)pBVar5 - (long)pBVar6 >> 4;
  pvVar10->parameter = sVar12;
  if (auStack_58 != (undefined1  [8])0x0) {
    psVar7 = *(size_type **)((long)auStack_58 + 8);
    for (psVar11 = *(size_type **)auStack_58; psVar11 != psVar7; psVar11 = psVar11 + 1) {
      pvVar10 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::at
                          (&((this->ec).
                             super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->byteCode,*psVar11);
      pvVar10->parameter = sVar12;
    }
  }
  peVar2 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ppuVar1 = &(peVar2->loopStartIndices).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  ppuVar1 = &(peVar2->loopConditionEvalJumpIndices).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&vec);
  return;
}

Assistant:

void onExitWhileStatementAstNode(WhileStatementAstNode*  /*node*/) noexcept override {
    Error::assertWithPanic(!this->ec->loopStartIndices.empty(),
      "onExitWhileStatementAstNode encountered while exit statement but loopStartIndices is empty");

    Error::assertWithPanic(!this->ec->loopConditionEvalJumpIndices.empty(),
      "onExitWhileStatementAstNode encountered while exit statement but loopConditionEvalJumpIndices is empty");

    std::size_t loopStartIndex = this->ec->loopStartIndices.at(this->ec->loopStartIndices.size() - 1);
    std::size_t loopJumpIfFalseIndex = this->ec->loopConditionEvalJumpIndices.at(this->ec->loopConditionEvalJumpIndices.size() - 1);

    auto find = this->ec->breakStatementsForLoops.find(loopStartIndex);

    std::shared_ptr<std::vector<std::size_t>> vec = nullptr;

    if (find != this->ec->breakStatementsForLoops.end()) {
      vec = find->second;
    }

    this->emit(bytecode::ByteCodeInstruction::Jump, loopStartIndex);

    std::size_t loopEnd = this->ec->byteCode.size();

    this->ec->UpdateParameterAtIndex(loopJumpIfFalseIndex, loopEnd);

    if (vec != nullptr) {
      for (const auto breakIndex : *vec) {
        this->ec->UpdateParameterAtIndex(breakIndex, loopEnd);
      }
    }

    this->ec->loopStartIndices.pop_back();
    this->ec->loopConditionEvalJumpIndices.pop_back();
  }